

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
::
AssertHashEqConsistent<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
           *this,pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                 *key)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  bool bVar3;
  uint32_t uVar4;
  slot_type *psVar5;
  size_t sVar6;
  ulong uVar7;
  ushort x;
  undefined1 (*pauVar8) [16];
  anon_class_24_3_2b146c49 assert_consistent;
  size_t hash_of_arg;
  GroupPortableImpl local_80;
  ulong local_78;
  anon_class_24_3_2b146c49 local_70;
  anon_class_24_3_2b146c49 local_58;
  size_t local_38;
  
  bVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                   *)this);
  if (!bVar3) {
    local_38 = hash_internal::MixingHashState::
               hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                         (key);
    local_70.hash_of_arg = &local_38;
    local_70.key = key;
    local_70.this =
         (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          *)this;
    bVar3 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)this);
    if (bVar3) {
      psVar5 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                           *)this);
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
      ::
      AssertHashEqConsistent<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
      ::anon_class_24_3_2b146c49::operator()(&local_70,(ctrl_t *)0x0,psVar5);
    }
    else {
      sVar6 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                          *)this);
      if (sVar6 < 0x11) {
        psVar5 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                 ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                               *)this);
        local_58.hash_of_arg = local_70.hash_of_arg;
        local_58.key = local_70.key;
        local_58.this = local_70.this;
        uVar7 = *(ulong *)this;
        pauVar2 = *(undefined1 (**) [16])(this + 0x10);
        if (uVar7 < 0xf) {
          if (8 < uVar7) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          local_80.ctrl = *(uint64_t *)(*pauVar2 + uVar7);
          local_80.ctrl = (uint64_t)GroupPortableImpl::MaskFull(&local_80);
          for (; local_80.ctrl != 0; local_80.ctrl = local_80.ctrl - 1 & local_80.ctrl) {
            uVar4 = NonIterableBitMask<unsigned_long,_8,_3>::LowestBitSet
                              ((NonIterableBitMask<unsigned_long,_8,_3> *)&local_80);
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::
            AssertHashEqConsistent<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
            ::anon_class_24_3_2b146c49::operator()
                      (&local_58,pauVar2[-1] + (ulong)uVar4 + 0xf,psVar5 + ((ulong)uVar4 - 1));
          }
        }
        else {
          uVar7 = *(ulong *)(this + 8) >> 1;
          local_78 = uVar7;
          while (pauVar8 = pauVar2, uVar7 != 0) {
            auVar1 = *pauVar8;
            for (x = ~((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar1[0xf] >> 7) << 0xf); x != 0; x = x - 1 & x) {
              uVar4 = TrailingZeros<unsigned_short>(x);
              if ((char)(*pauVar8)[uVar4] < '\0') {
                __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x79d,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::
              AssertHashEqConsistent<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
              ::anon_class_24_3_2b146c49::operator()(&local_58,*pauVar8 + uVar4,psVar5 + uVar4);
              uVar7 = uVar7 - 1;
            }
            psVar5 = psVar5 + 0x10;
            pauVar2 = pauVar8 + 1;
            if ((uVar7 != 0) && ((*pauVar8)[0xf] == -1)) {
              __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7a5,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
          if (local_78 < *(ulong *)(this + 8) >> 1) {
            __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7aa,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AssertHashEqConsistent(const K& key) {
#ifdef NDEBUG
    return;
#endif
    // If the hash/eq functors are known to be consistent, then skip validation.
    if (std::is_same<hasher, absl::container_internal::StringHash>::value &&
        std::is_same<key_equal, absl::container_internal::StringEq>::value) {
      return;
    }
    if (std::is_scalar<key_type>::value &&
        std::is_same<hasher, absl::Hash<key_type>>::value &&
        std::is_same<key_equal, std::equal_to<key_type>>::value) {
      return;
    }
    if (empty()) return;

    const size_t hash_of_arg = hash_ref()(key);
    const auto assert_consistent = [&](const ctrl_t*, slot_type* slot) {
      const value_type& element = PolicyTraits::element(slot);
      const bool is_key_equal =
          PolicyTraits::apply(EqualElement<K>{key, eq_ref()}, element);
      if (!is_key_equal) return;

      const size_t hash_of_slot =
          PolicyTraits::apply(HashElement{hash_ref()}, element);
      ABSL_ATTRIBUTE_UNUSED const bool is_hash_equal =
          hash_of_arg == hash_of_slot;
      assert((!is_key_equal || is_hash_equal) &&
             "eq(k1, k2) must imply that hash(k1) == hash(k2). "
             "hash/eq functors are inconsistent.");
    };

    if (is_soo()) {
      assert_consistent(/*unused*/ nullptr, soo_slot());
      return;
    }
    // We only do validation for small tables so that it's constant time.
    if (capacity() > 16) return;
    IterateOverFullSlots(common(), slot_array(), assert_consistent);
  }